

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O2

bool __thiscall SGParser::Generator::Lex::MakeDFAUsingNFA(Lex *this,DFAGen *dfa)

{
  uint uVar1;
  uint uVar2;
  pointer pbVar3;
  pointer pLVar4;
  pointer pLVar5;
  pointer pEVar6;
  pointer ppNVar7;
  bool bVar8;
  iterator iVar9;
  NFA *pNVar10;
  mapped_type *ppNVar11;
  _Rb_tree_node_base *p_Var12;
  ulong uVar13;
  ulong uVar14;
  pointer __k;
  undefined1 auVar15 [8];
  long lVar16;
  undefined1 auStack_188 [8];
  DFAGen dfa2;
  undefined1 local_c8 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
  macroNFAs;
  undefined1 local_90 [8];
  NFA combinedNFA;
  undefined1 auStack_58 [8];
  vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_> lexemeNFAList;
  
  macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&macroNFAs;
  macroNFAs._M_t._M_impl._0_4_ = 0;
  macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  __k = (this->MacroNames).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (this->MacroNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((long)pbVar3 - (long)__k >> 5 !=
      (this->Macros)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    __assert_fail("MacroNames.size() == Macros.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                  ,0x41e,"bool SGParser::Generator::Lex::MakeDFAUsingNFA(DFAGen &)");
  }
  for (; __k != pbVar3; __k = __k + 1) {
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)this,__k);
    if ((_Rb_tree_header *)iVar9._M_node == &(this->Macros)._M_t._M_impl.super__Rb_tree_header) {
      __assert_fail("iter != Macros.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                    ,0x421,"bool SGParser::Generator::Lex::MakeDFAUsingNFA(DFAGen &)");
    }
    pNVar10 = (NFA *)operator_new(0x28);
    pNVar10->LexemeId = 0xffffffff;
    pNVar10->pStartState = (NFANode *)0x0;
    (pNVar10->FinalState).
    super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pNVar10->FinalState).
    super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pNVar10->FinalState).
    super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar8 = MakeNFA(this,pNVar10,(String *)(iVar9._M_node + 2),
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                     *)local_c8);
    if (bVar8) {
      ppNVar11 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                 ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                               *)local_c8,__k);
      *ppNVar11 = pNVar10;
    }
    else {
      NFA::~NFA(pNVar10);
      operator_delete(pNVar10,0x28);
    }
  }
  pLVar4 = (this->Lexemes).super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pLVar5 = (this->Lexemes).super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((pLVar4 != pLVar5) &&
     ((this->Expressions).
      super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->Expressions).
      super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    auStack_188 = (undefined1  [8])(((long)pLVar4 - (long)pLVar5) / 0x68 << 0x20);
    std::
    vector<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
    ::emplace_back<SGParser::Generator::Lex::Expression>
              (&this->Expressions,(Expression *)auStack_188);
  }
  combinedNFA.FinalState.
  super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&this->Lexemes;
  lexemeNFAList.
  super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_58 = (undefined1  [8])0x0;
  lexemeNFAList.
  super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dfa2.super_DFA.CharTable._0_8_ =
       &dfa2.super_DFA.CharTable.values._M_h._M_rehash_policy._M_next_resize;
  dfa2.super_DFA.ExpressionStartStates.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dfa2.super_DFA.ExpressionStartStates.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dfa2.super_DFA.LexemeInfos.
  super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dfa2.super_DFA.LexemeInfos.
  super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dfa2.super_DFA.AcceptStates.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dfa2.super_DFA.LexemeInfos.
  super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dfa2.super_DFA.AcceptStates.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dfa2.super_DFA.AcceptStates.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dfa2.super_DFA.TransitionTable.
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dfa2.super_DFA.TransitionTable.
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_188._0_4_ = 0;
  auStack_188._4_4_ = 0;
  dfa2.super_DFA.TransitionTable.
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dfa2.super_DFA.ExpressionStartStates.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
  dfa2.super_DFA.CharTable.values._M_h._M_buckets = (__buckets_ptr)0x1;
  dfa2.super_DFA.CharTable.values._M_h._M_bucket_count = 0;
  dfa2.super_DFA.CharTable.values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  dfa2.super_DFA.CharTable.values._M_h._M_element_count._0_4_ = 0x3f800000;
  dfa2.super_DFA.CharTable.values._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  dfa2.super_DFA.CharTable.values._M_h._M_rehash_policy._4_4_ = 0;
  dfa2.super_DFA.CharTable.values._M_h._M_rehash_policy._M_next_resize = 0;
  dfa2.super_DFA.CharTable.values._M_h._M_single_bucket._0_4_ = 0xff;
  dfa2.Messages.Flags = 0;
  dfa2.Messages._4_4_ = 0;
  dfa2.Messages.pMessages = (Messages *)0x0;
  uVar13 = 0;
  do {
    pEVar6 = (this->Expressions).
             super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
             ._M_impl.super__Vector_impl_data._M_start;
    macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (long)(this->Expressions).
               super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
               ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar6 >> 3;
    p_Var12 = macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count <= uVar13) {
      for (; p_Var12 != (_Rb_tree_node_base *)&macroNFAs;
          p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12)) {
        pNVar10 = *(NFA **)(p_Var12 + 2);
        if (pNVar10 != (NFA *)0x0) {
          NFA::~NFA(pNVar10);
        }
        operator_delete(pNVar10,0x28);
      }
LAB_00133697:
      bVar8 = macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count <= uVar13;
      DFA::~DFA((DFA *)auStack_188);
      std::_Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>::
      ~_Vector_base((_Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                     *)auStack_58);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                   *)local_c8);
      return bVar8;
    }
    uVar1 = pEVar6[uVar13].StartLexeme;
    uVar14 = (ulong)uVar1;
    uVar2 = pEVar6[uVar13].LexemeCount;
    lVar16 = uVar14 * 0x68 + 0x20;
    for (; uVar14 < uVar2 + uVar1; uVar14 = uVar14 + 1) {
      local_90 = (undefined1  [8])operator_new(0x28);
      ((NFA *)local_90)->LexemeId = (int)uVar14 + 2;
      ((NFA *)local_90)->pStartState = (NFANode *)0x0;
      (((NFA *)local_90)->FinalState).
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (((NFA *)local_90)->FinalState).
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (((NFA *)local_90)->FinalState).
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar8 = MakeNFA(this,(NFA *)local_90,
                      (String *)
                      ((long)&(((this->Lexemes).
                                super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>
                                ._M_impl.super__Vector_impl_data._M_start)->Name)._M_dataplus._M_p +
                      lVar16),(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                               *)local_c8);
      if (!bVar8) {
        CheckForErrorAndReport
                  (this,"Failed to make an NFA from the \'%s\' expression.",
                   *(undefined8 *)
                    ((long)&(((this->Lexemes).
                              super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>
                              ._M_impl.super__Vector_impl_data._M_start)->Name)._M_dataplus._M_p +
                    lVar16));
        auVar15 = local_90;
        if (local_90 != (undefined1  [8])0x0) {
          NFA::~NFA((NFA *)local_90);
        }
        operator_delete((void *)auVar15,0x28);
        ppNVar7 = lexemeNFAList.
                  super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        for (auVar15 = auStack_58; auVar15 != (undefined1  [8])ppNVar7;
            auVar15 = (undefined1  [8])((long)auVar15 + 8)) {
          pNVar10 = *(NFA **)auVar15;
          if (pNVar10 != (NFA *)0x0) {
            NFA::~NFA(pNVar10);
          }
          operator_delete(pNVar10,0x28);
        }
        goto LAB_00133697;
      }
      std::vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>::
      push_back((vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_> *)
                auStack_58,(value_type *)local_90);
      lVar16 = lVar16 + 0x68;
    }
    local_90._0_4_ = 1;
    combinedNFA.FinalState.
    super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    combinedNFA.FinalState.
    super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    combinedNFA.LexemeId = 0;
    combinedNFA._4_4_ = 0;
    combinedNFA.pStartState = (NFANode *)0x0;
    NFA::CombineNFAs((NFA *)local_90,
                     (vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                      *)auStack_58);
    ppNVar7 = lexemeNFAList.
              super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (auVar15 = auStack_58; auVar15 != (undefined1  [8])ppNVar7;
        auVar15 = (undefined1  [8])((long)auVar15 + 8)) {
      pNVar10 = *(NFA **)auVar15;
      if (pNVar10 != (NFA *)0x0) {
        NFA::~NFA(pNVar10);
      }
      operator_delete(pNVar10,0x28);
    }
    if ((undefined1  [8])
        lexemeNFAList.
        super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>.
        _M_impl.super__Vector_impl_data._M_start != auStack_58) {
      lexemeNFAList.
      super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_58;
    }
    if (uVar13 == 0) {
      DFAGen::Create(dfa,(NFA *)local_90,
                     (vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_> *)
                     combinedNFA.FinalState.
                     super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,0x100);
    }
    else {
      DFAGen::Create((DFAGen *)auStack_188,(NFA *)local_90,
                     (vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_> *)
                     combinedNFA.FinalState.
                     super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                     (int)(dfa->super_DFA).CharTable.values._M_h._M_element_count - 1);
      bVar8 = DFAGen::Combine(dfa,(DFAGen *)auStack_188);
      if (!bVar8) {
        CheckForErrorAndReport(this,"Failed to combine DFAs.");
        NFA::~NFA((NFA *)local_90);
        goto LAB_00133697;
      }
    }
    NFA::~NFA((NFA *)local_90);
    uVar13 = uVar13 + 1;
  } while( true );
}

Assistant:

bool Lex::MakeDFAUsingNFA(DFAGen& dfa) {
    // Store the macro NFAs
    std::map<String, NFA*> macroNFAs;

    // Go through all macros (in declaration-order) and create NFA's for them.
    // ("In declaration-order" so a lexically-later macro can refer to a lexically-earlier macro.)
    SG_ASSERT(MacroNames.size() == Macros.size());
    for (const String& name : MacroNames) {
        auto const iter = Macros.find(name);
        SG_ASSERT(iter != Macros.end());
        auto const& regExp = iter->second;

        // Create a new nfa to be filled
        const auto pnfa = new NFA;

        // if the nfa failed to initialize then quite
        if (MakeNFA(*pnfa, regExp, macroNFAs))
            macroNFAs[name] = pnfa;
        else
            delete pnfa; // Should we report an error?
    }

    // If there are lexemes, but not a single expression
    // make an expression for them (special case)
    if (Lexemes.size() && !Expressions.size())
        Expressions.push_back({0u, unsigned(Lexemes.size())});

    // Go through all expression lexemes and construct a list of DFA
    std::vector<NFA*> lexemeNFAList;
    DFAGen            dfa2;

    for (size_t i = 0u; i < Expressions.size(); ++i) {
        // Store NFAs for this expression
        const auto EndLexeme = Expressions[i].StartLexeme + Expressions[i].LexemeCount;
        for (unsigned j = Expressions[i].StartLexeme; j < EndLexeme; ++j) {
            const auto pnfa = new NFA{j + TokenCode::TokenFirstID};

            // if the nfa failed to initialize then quit
            if (!MakeNFA(*pnfa, Lexemes[j].RegularExpression, macroNFAs)) {
                // ERROR: Making an NFA from RE failed, probably syntax error in RE
                CheckForErrorAndReport("Failed to make an NFA from the '%s' expression.",
                                       Lexemes[j].RegularExpression.data());

                // This seems to be necessary here in case of error
                delete pnfa;
                for (const auto nfa : lexemeNFAList)
                    delete nfa;

                return false;
            }

            lexemeNFAList.push_back(pnfa);
        }

        // Combine all the individual NFAs into one
        NFA combinedNFA{1u};
        combinedNFA.CombineNFAs(lexemeNFAList);

        for (const auto nfa: lexemeNFAList)
            delete nfa;
        lexemeNFAList.clear();

        // Make a DFA from the huge NFA
        // Should really have a more complex character-counting scheme!
        if (i == 0u)
            dfa.Create(combinedNFA, Lexemes, 256u);
        else {
            // And combine it to form an expression
            dfa2.Create(combinedNFA, Lexemes, unsigned(dfa.GetCharCount() - 1u));
            if (!dfa.Combine(dfa2)) {
                // ERROR: Failed to combine DFAs, probably inconsistent states
                CheckForErrorAndReport("Failed to combine DFAs.");
                return false;
            }
        }
    }

    // Free all the macro NFA's
    for (const auto& [_, nfa] : macroNFAs)
        delete nfa;

    return true;
}